

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupRepresDfs(Aig_Man_t *p)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  Aig_Man_t *pNew;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  int *__dest;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *pAVar10;
  ulong uVar11;
  long lVar12;
  
  pNew = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  pNew->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  pNew->pSpec = pcVar7;
  iVar5 = p->nBarBufs;
  pNew->nConstrs = p->nConstrs;
  pNew->nBarBufs = iVar5;
  pVVar2 = p->vFlopNums;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    iVar5 = pVVar2->nSize;
    pVVar8->nSize = iVar5;
    pVVar8->nCap = iVar5;
    if ((long)iVar5 == 0) {
      sVar6 = 0;
      __dest = (int *)0x0;
    }
    else {
      sVar6 = (long)iVar5 << 2;
      __dest = (int *)malloc(sVar6);
    }
    pVVar8->pArray = __dest;
    memcpy(__dest,pVVar2->pArray,sVar6);
    pNew->vFlopNums = pVVar8;
  }
  Aig_ManCleanData(p);
  pVVar9 = p->vObjs;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      pvVar3 = pVVar9->pArray[lVar12];
      if ((pvVar3 != (void *)0x0) &&
         (uVar4 = (uint)*(undefined8 *)((long)pvVar3 + 0x18), (uVar4 & 7) - 7 < 0xfffffffe)) {
        uVar4 = uVar4 & 7;
        if (uVar4 == 3) {
          Aig_ManDupRepres_rec
                    (pNew,p,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe));
          uVar11 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          if ((p->pReprs == (Aig_Obj_t **)0x0) ||
             (pAVar10 = p->pReprs[*(int *)(uVar11 + 0x24)], pAVar10 == (Aig_Obj_t *)0x0)) {
            uVar11 = *(ulong *)(uVar11 + 0x28);
          }
          else {
            uVar11 = (ulong)((*(uint *)&pAVar10->field_0x18 ^ *(uint *)(uVar11 + 0x18)) >> 3 & 1) ^
                     (ulong)(pAVar10->field_5).pData;
          }
          pAVar10 = Aig_ObjCreateCo(pNew,(Aig_Obj_t *)
                                         ((uint)*(ulong *)((long)pvVar3 + 8) & 1 ^ uVar11));
        }
        else if (uVar4 == 2) {
          pAVar10 = Aig_ObjCreateCi(pNew);
        }
        else {
          if (((ulong)pvVar3 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
          }
          if (uVar4 != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                          ,0x400,"Aig_Man_t *Aig_ManDupRepresDfs(Aig_Man_t *)");
          }
          pAVar10 = pNew->pConst1;
        }
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar10;
      }
      lVar12 = lVar12 + 1;
      pVVar9 = p->vObjs;
    } while (lVar12 < pVVar9->nSize);
  }
  Aig_ManSetRegNum(pNew,p->nRegs);
  iVar5 = Aig_ManCheck(pNew);
  if (iVar5 == 0) {
    puts("Aig_ManDupRepresDfs: Check has failed.");
  }
  return pNew;
}

Assistant:

Aig_Man_t * Aig_ManDupRepresDfs( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // start the HOP package
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjIsCi(pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
        else if ( Aig_ObjIsCo(pObj) )
        {
            Aig_ManDupRepres_rec( pNew, p, Aig_ObjFanin0(pObj) );
            pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Repres(p, pObj) );
        }
        else if ( Aig_ObjIsConst1(pObj) )
            pObj->pData = Aig_ManConst1(pNew);
        else 
            assert( 0 );
    }
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the new manager
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupRepresDfs: Check has failed.\n" );
    return pNew;
}